

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O1

void ht_put(HashTable *ht,HTItemKey key,CrispyValue value)

{
  uint32_t uVar1;
  HTKeyType HVar2;
  table_item_t *ptVar3;
  _func_void_HTItem_ptr *p_Var4;
  _Bool _Var5;
  uint32_t uVar6;
  HTItem *pHVar7;
  HTItem *pHVar8;
  uint64_t uVar9;
  HTItemKey *pHVar10;
  table_item_t **pptVar11;
  ulong uVar12;
  CrispyValue value_00;
  HashTable local_58;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_38;
  
  local_38 = value.field_1;
  uVar6 = hash(key,ht->key_type);
  uVar1 = ht->cap;
  pHVar7 = (HTItem *)malloc(0x28);
  pHVar7->next = (table_item_t *)0x0;
  (pHVar7->key).field_0.key_ident_string = key.key_c_string;
  (pHVar7->key).field_0.ident_length = key.field_0.ident_length;
  (pHVar7->value).type = value.type;
  (pHVar7->value).field_1.p_value = (uint64_t)local_38;
  pptVar11 = ht->buckets + (uVar1 - 1 & uVar6);
  pHVar8 = *pptVar11;
  if (pHVar8 != (HTItem *)0x0) {
    HVar2 = ht->key_type;
    do {
      _Var5 = equals((HTItemKey)*(anon_struct_16_2_64a7050e_for_HTItemKey_0 *)&pHVar8->key,key,HVar2
                    );
      if (_Var5) {
        ptVar3 = (*pptVar11)->next;
        free(*pptVar11);
        *pptVar11 = pHVar7;
        pHVar7->next = ptVar3;
        goto LAB_001024e3;
      }
      pHVar8 = (*pptVar11)->next;
      pptVar11 = &(*pptVar11)->next;
    } while (pHVar8 != (HTItem *)0x0);
  }
  *pptVar11 = pHVar7;
  ht->size = ht->size + 1;
LAB_001024e3:
  if (ht->cap < ht->size) {
    HVar2 = ht->key_type;
    uVar9 = next_pow_of_2((ulong)(ht->cap + 1));
    p_Var4 = ht->free_callback;
    uVar9 = next_pow_of_2(uVar9 & 0xffffffff);
    local_58.cap = (uint32_t)uVar9;
    local_58.size = 0;
    local_58.buckets = (HTItem **)0x0;
    local_58.key_type = HVar2;
    local_58.free_callback = p_Var4;
    local_58.buckets = (HTItem **)calloc(uVar9 & 0xffffffff,8);
    if (ht->cap != 0) {
      uVar12 = 0;
      do {
        for (pHVar10 = &ht->buckets[uVar12]->key; pHVar10 != (HTItemKey *)0x0;
            pHVar10 = (HTItemKey *)pHVar10[2].key_obj_string) {
          value_00._4_4_ = 0;
          value_00.type = pHVar10[1].key_int;
          value_00.field_1.p_value =
               ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)pHVar10 + 0x18))->p_value;
          ht_put(&local_58,*pHVar10,value_00);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < ht->cap);
    }
    ht_free(ht);
    ht->free_callback = local_58.free_callback;
    ht->buckets = local_58.buckets;
    ht->key_type = local_58.key_type;
    ht->cap = local_58.cap;
    *(ulong *)&ht->size = CONCAT44(local_58._12_4_,local_58.size);
  }
  return;
}

Assistant:

void ht_put(HashTable *ht, HTItemKey key, CrispyValue value) {
    uint32_t index = hash(key, ht->key_type) & (ht->cap - 1);
    HTItem *new_item = malloc(sizeof(HTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, ht->key_type, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}